

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O1

void __thiscall piksel::Graphics::point(Graphics *this,float x,float y)

{
  float c;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar1;
  _Elt_pointer pSVar2;
  undefined8 uVar3;
  _Elt_pointer pSVar4;
  
  push(this);
  psVar1 = this->stateStack;
  pSVar4 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  uVar3 = *(undefined8 *)((long)&pSVar4[-1].shaderRelevantState.strokeColor.field_0 + 8);
  *(undefined8 *)&pSVar4[-1].shaderRelevantState.fillColor.field_0 =
       *(undefined8 *)&pSVar4[-1].shaderRelevantState.strokeColor.field_0;
  *(undefined8 *)((long)&pSVar4[-1].shaderRelevantState.fillColor.field_0 + 8) = uVar3;
  pSVar4[-1].shaderIrrelevantState.fill = pSVar4[-1].shaderIrrelevantState.stroke;
  pSVar4[-1].shaderIrrelevantState.stroke = false;
  c = pSVar4[-1].shaderRelevantState.strokeWeight;
  psVar1 = this->stateStack;
  pSVar4 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pSVar2 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  if (c <= 1.0) {
    if (pSVar4 == pSVar2) {
      pSVar4 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 2;
    }
    pSVar4[-1].shaderIrrelevantState.rectMode = CENTER;
    rect(this,x,y,c,c);
  }
  else {
    if (pSVar4 == pSVar2) {
      pSVar4 = (psVar1->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 2;
    }
    pSVar4[-1].shaderIrrelevantState.ellipseMode = CENTER;
    ellipse(this,x,y,c,c);
  }
  pop(this);
  return;
}

Assistant:

void Graphics::point(float x, float y) {
	push();
	State& state = peek();
	state.shaderRelevantState.fillColor = state.shaderRelevantState.strokeColor;
    state.shaderIrrelevantState.fill = state.shaderIrrelevantState.stroke;
    state.shaderIrrelevantState.stroke = false;
    if (state.shaderRelevantState.strokeWeight <= 1.0f) {
        rectMode(DrawMode::CENTER);
        rect(x, y, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    } else {
        ellipseMode(DrawMode::CENTER);
        ellipse(x, y, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    }
	pop();
}